

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

nng_err nng_http_server_start(nng_http_server *srv)

{
  nng_err nVar1;
  nng_http_server *srv_local;
  
  nVar1 = nni_http_server_start(srv);
  return nVar1;
}

Assistant:

nng_err
nng_http_server_start(nng_http_server *srv)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_server_start(srv));
#else
	NNI_ARG_UNUSED(srv);
	return (NNG_ENOTSUP);
#endif
}